

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode baller_start(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller,timediff_t timeoutms)

{
  Curl_addrinfo *pCVar1;
  curltime cVar2;
  long local_50;
  long local_48;
  undefined4 uStack_2c;
  timediff_t timeoutms_local;
  eyeballer *baller_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  baller->error = 0;
  baller->field_0x64 = baller->field_0x64 & 0xf7;
  baller->field_0x64 = baller->field_0x64 & 0xfd | 2;
  while (baller->addr != (Curl_addrinfo *)0x0) {
    cVar2 = Curl_now();
    (baller->started).tv_sec = cVar2.tv_sec;
    *(ulong *)&(baller->started).tv_usec = CONCAT44(uStack_2c,cVar2.tv_usec);
    pCVar1 = addr_next_match(baller->addr,baller->ai_family);
    local_50 = timeoutms;
    if (pCVar1 != (Curl_addrinfo *)0x0) {
      local_48 = timeoutms;
      if (600 < timeoutms) {
        local_48 = timeoutms / 2;
      }
      local_50 = local_48;
    }
    baller->timeoutms = local_50;
    baller_initiate(cf,data,baller);
    if (baller->result == CURLE_OK) break;
    baller_next_addr(baller);
  }
  if (baller->addr == (Curl_addrinfo *)0x0) {
    baller->field_0x64 = baller->field_0x64 & 0xfb | 4;
  }
  return baller->result;
}

Assistant:

static CURLcode baller_start(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             struct eyeballer *baller,
                             timediff_t timeoutms)
{
  baller->error = 0;
  baller->connected = FALSE;
  baller->has_started = TRUE;

  while(baller->addr) {
    baller->started = Curl_now();
    baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
      USETIME(timeoutms) : timeoutms;
    baller_initiate(cf, data, baller);
    if(!baller->result)
      break;
    baller_next_addr(baller);
  }
  if(!baller->addr) {
    baller->is_done = TRUE;
  }
  return baller->result;
}